

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::anon_unknown_1::average<unsigned_char>
               (uchar *src,int sstride,int uw,int vw,uchar *dst,int nchan)

{
  long lVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  uchar *puVar5;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar1 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar1);
  local_38 = (float)vw;
  local_34 = uw;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x10f5b3;
  memset(__s,0,(long)nchan << 2);
  if ((int)local_38 * sstride != 0) {
    puVar2 = src + (int)local_38 * sstride;
    iVar3 = nchan * local_34;
    do {
      puVar5 = src;
      if (iVar3 != 0) {
        puVar5 = src + iVar3;
        do {
          if (0 < nchan) {
            uVar4 = 0;
            do {
              *(float *)((long)__s + uVar4 * 4) =
                   (float)src[uVar4] + *(float *)((long)__s + uVar4 * 4);
              uVar4 = uVar4 + 1;
            } while ((uint)nchan != uVar4);
            src = src + uVar4;
          }
        } while (src != puVar5);
      }
      src = puVar5 + (sstride - iVar3);
    } while (src != puVar2);
  }
  if (0 < nchan) {
    uVar4 = 0;
    do {
      dst[uVar4] = (uchar)(int)(*(float *)((long)__s + uVar4 * 4) *
                               (1.0 / (float)((int)local_38 * local_34)));
      uVar4 = uVar4 + 1;
    } while ((uint)nchan != uVar4);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }